

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaeger_types.cpp
# Opt level: O0

void __thiscall jaegertracing::thrift::Tag::Tag(Tag *this,Tag *other1)

{
  Tag *other1_local;
  Tag *this_local;
  
  apache::thrift::TBase::TBase((TBase *)this);
  *(undefined ***)this = &PTR__Tag_00518e40;
  *(undefined ***)this = &PTR__Tag_00518e40;
  std::__cxx11::string::string((string *)&this->key);
  std::__cxx11::string::string((string *)&this->vStr);
  std::__cxx11::string::string((string *)&this->vBinary);
  _Tag__isset::_Tag__isset(&this->__isset);
  std::__cxx11::string::operator=((string *)&this->key,(string *)&other1->key);
  this->vType = other1->vType;
  std::__cxx11::string::operator=((string *)&this->vStr,(string *)&other1->vStr);
  this->vDouble = other1->vDouble;
  this->vBool = (bool)(other1->vBool & 1);
  this->vLong = other1->vLong;
  std::__cxx11::string::operator=((string *)&this->vBinary,(string *)&other1->vBinary);
  this->__isset = other1->__isset;
  return;
}

Assistant:

Tag::Tag(const Tag& other1) {
  key = other1.key;
  vType = other1.vType;
  vStr = other1.vStr;
  vDouble = other1.vDouble;
  vBool = other1.vBool;
  vLong = other1.vLong;
  vBinary = other1.vBinary;
  __isset = other1.__isset;
}